

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O2

OffsetRange __thiscall
wabt::LexerSourceLineFinder::ClampSourceLineOffsets
          (LexerSourceLineFinder *this,OffsetRange offset_range,ColumnRange column_range,
          Offset max_line_length)

{
  int iVar1;
  unsigned_long uVar2;
  long lVar3;
  OffsetRange OVar5;
  LexerSourceLineFinder *pLVar4;
  
  iVar1 = (int)offset_range.end;
  uVar2 = offset_range.start;
  if ((ulong)column_range < uVar2 - (long)this) {
    if ((ulong)(long)(offset_range.end._4_4_ - iVar1) <= (ulong)column_range) {
      iVar1 = (offset_range.end._4_4_ + iVar1) / 2;
    }
    lVar3 = 0;
    if ((ulong)column_range >> 1 <= (ulong)(long)(iVar1 + -1)) {
      lVar3 = (long)(iVar1 + -1) - ((ulong)column_range >> 1);
    }
    pLVar4 = (LexerSourceLineFinder *)
             ((long)&(this->source_)._M_t.
                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + lVar3);
    this = (LexerSourceLineFinder *)(uVar2 - (long)column_range);
    if (pLVar4 <= (LexerSourceLineFinder *)(uVar2 - (long)column_range)) {
      this = pLVar4;
    }
    uVar2 = (long)&(this->source_)._M_t.
                   super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                   .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl +
            (long)column_range;
  }
  OVar5.end = uVar2;
  OVar5.start = (unsigned_long)this;
  return OVar5;
}

Assistant:

T size() const { return end - start; }